

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

void ARKodeButcherTable_Free(ARKodeButcherTable B)

{
  void *in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x28) != 0) {
      free(*(void **)((long)in_RDI + 0x28));
    }
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      free(*(void **)((long)in_RDI + 0x18));
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
    }
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      for (local_c = 0; local_c < *(int *)((long)in_RDI + 8); local_c = local_c + 1) {
        if (*(long *)(*(long *)((long)in_RDI + 0x10) + (long)local_c * 8) != 0) {
          free(*(void **)(*(long *)((long)in_RDI + 0x10) + (long)local_c * 8));
        }
      }
      free(*(void **)((long)in_RDI + 0x10));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void ARKodeButcherTable_Free(ARKodeButcherTable B)
{
  int i;

  /* Free each field within Butcher table structure, and then
     free structure itself */
  if (B != NULL) {
    if (B->d != NULL)  free(B->d);
    if (B->c != NULL)  free(B->c);
    if (B->b != NULL)  free(B->b);
    if (B->A != NULL) {
      for (i=0; i<B->stages; i++)
        if (B->A[i] != NULL)  free(B->A[i]);
      free(B->A);
    }

    free(B);
  }
}